

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclablePromiseObjectWalker::GetGroupObject
          (RecyclablePromiseObjectWalker *this,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ArenaAllocator *alloc;
  RecyclablePromiseObjectDisplay *this_00;
  RecyclableObject *this_01;
  Type TVar5;
  
  pResolvedObject->name = L"[Promise]";
  pResolvedObject->propId = -1;
  aValue = (this->super_RecyclableObjectWalker).instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_007f0c3f;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar5 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar5 = TypeIds_Number;
      goto LAB_007f0b1e;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007f0c3f;
      *puVar4 = 0;
    }
    TVar5 = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)TVar5) && (BVar3 = RecyclableObject::IsExternal(this_01), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_007f0c3f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
LAB_007f0b1e:
  pResolvedObject->typeId = TVar5;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  this_00 = (RecyclablePromiseObjectDisplay *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
  RecyclablePromiseObjectDisplay::RecyclablePromiseObjectDisplay(this_00,pResolvedObject);
  pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_00;
  (*(this_00->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay.
    _vptr_IDiagObjectModelDisplay[6])(this_00,0x820);
  return 1;
}

Assistant:

BOOL RecyclablePromiseObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = _u("[Promise]");
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclablePromiseObjectDisplay, pResolvedObject);
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        return TRUE;
    }